

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::sr::anon_unknown_0::TextureGatherCubeCase::createInstance
          (TextureGatherCubeCase *this,Context *context)

{
  GatherType gatherType;
  OffsetSize OVar1;
  int iVar2;
  GatherCubeArgs *__cur;
  VkPhysicalDeviceProperties *pVVar3;
  TextureGatherInstance *this_00;
  Context *pCVar4;
  pointer pGVar5;
  long lVar6;
  TextureFormat *format;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  iterations;
  vector<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
  local_48;
  TextureFormat local_30;
  
  gatherType = (this->m_baseParams).gatherType;
  OVar1 = (this->m_baseParams).offsetSize;
  pVVar3 = Context::getDeviceProperties(context);
  if (OVar1 == OFFSETSIZE_NONE) {
    local_30.order = R;
    local_30.type = SNORM_INT8;
  }
  else if (OVar1 == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
    local_30.order = (pVVar3->limits).minTexelGatherOffset;
    local_30.type = (pVVar3->limits).maxTexelGatherOffset;
  }
  else if (OVar1 == OFFSETSIZE_MINIMUM_REQUIRED) {
    local_30.order = ~RGB;
    local_30.type = UNORM_BYTE_44;
  }
  else {
    local_30.order = ~R;
    local_30.type = ~SNORM_INT8;
  }
  generateCubeCaseIterations
            (&local_48,gatherType,&(this->m_baseParams).textureFormat,(IVec2 *)&local_30);
  this_00 = (TextureGatherInstance *)operator_new(1000);
  iVar2 = this->m_textureSize;
  TextureGatherInstance::TextureGatherInstance(this_00,context,&this->m_baseParams);
  (this_00->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TextureGatherCubeInstance_00d2da98;
  *(int *)&this_00->field_0x264 = iVar2;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)0x0;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = (Context *)0x0;
  this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode = IMAGE_BACKING_MODE_REGULAR;
  this_00[1].super_ShaderRenderCaseInstance.m_quadGridSize = 0;
  pCVar4 = (Context *)
           std::
           _Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
           ::_M_allocate((_Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          *)(((long)local_48.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333),(size_t)context);
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)pCVar4;
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar4;
  *(long *)&this_00[1].super_ShaderRenderCaseInstance.m_imageBackingMode =
       ((long)local_48.
              super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_48.
             super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
             ._M_impl.super__Vector_impl_data._M_start) + (long)pCVar4;
  for (pGVar5 = local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pGVar5 != local_48.
                super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                ._M_impl.super__Vector_impl_data._M_finish; pGVar5 = pGVar5 + 1) {
    *(int *)&pCVar4->m_testCtx = (pGVar5->gatherArgs).componentNdx;
    lVar6 = 1;
    do {
      *(int *)((long)pCVar4 + lVar6 * 8 + -4) = (pGVar5->gatherArgs).offsets[lVar6 + -1].m_data[0];
      *(int *)(&pCVar4->m_testCtx + lVar6) = (pGVar5->gatherArgs).offsets[lVar6 + -1].m_data[1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 5);
    *(CubeFace *)
     &(pCVar4->m_device).
      super_UniqueBase<vkt::DefaultDevice,_de::DefaultDeleter<vkt::DefaultDevice>_>.m_data.field_0xc
         = pGVar5->face;
    pCVar4 = (Context *)&pCVar4->m_allocator;
  }
  this_00[1].super_ShaderRenderCaseInstance.super_TestInstance.m_context = pCVar4;
  format = &local_30;
  local_30.order = CHANNELORDER_LAST;
  local_30.type = CHANNELTYPE_LAST;
  tcu::TextureCube::TextureCube
            ((TextureCube *)&this_00[1].super_ShaderRenderCaseInstance.m_sparseContext,format,1);
  TextureGatherInstance::init(this_00,(EVP_PKEY_CTX *)format);
  if (local_48.
      super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<vkt::sr::(anonymous_namespace)::GatherCubeArgs,_std::allocator<vkt::sr::(anonymous_namespace)::GatherCubeArgs>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (TestInstance *)this_00;
}

Assistant:

TestInstance* TextureGatherCubeCase::createInstance (Context& context) const
{
	const vector<GatherCubeArgs>	iterations	= generateCubeCaseIterations(m_baseParams.gatherType,
																			 m_baseParams.textureFormat,
																			 getOffsetRange(m_baseParams.offsetSize, context.getDeviceProperties().limits));

	return new TextureGatherCubeInstance(context, m_baseParams, m_textureSize, iterations);
}